

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::BasicWriter<char>::write_int<long_long,fmt::FormatSpec>
          (BasicWriter<char> *this,longlong value,FormatSpec spec)

{
  undefined4 uVar1;
  lconv *plVar2;
  size_t __n;
  CharPtr __dest;
  long lVar3;
  byte *pbVar4;
  CharPtr pcVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  char in_stack_ffffffffffffffaf;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar13;
  
  uVar1 = spec._20_4_;
  uVar13 = 0;
  if (value < 0) {
    uVar13 = 0x2d;
    value = -value;
LAB_00109a9f:
    uVar10 = 1;
  }
  else {
    uVar10 = 0;
    if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
      bVar9 = 0x2b;
      if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
        bVar9 = 0x20;
      }
      uVar13 = (uint)bVar9;
      goto LAB_00109a9f;
    }
  }
  spec._20_4_ = uVar1;
  if ((byte)spec.type_ < 100) {
    if ((byte)spec.type_ < 0x58) {
      if (spec.type_ == '\0') goto LAB_00109e08;
      if (spec.type_ == 'B') {
LAB_00109d15:
        uVar13 = uVar10;
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          (&stack0xffffffffffffffb4)[uVar10] = 0x30;
          uVar13 = uVar10 | 2;
          (&stack0xffffffffffffffb5)[uVar10] = spec.type_;
        }
        uVar10 = 0;
        uVar6 = value;
        do {
          uVar10 = uVar10 + 1;
          bVar12 = 1 < uVar6;
          uVar6 = uVar6 >> 1;
        } while (bVar12);
        pbVar4 = (byte *)prepare_int_buffer<fmt::FormatSpec>
                                   (this,uVar10,&spec,&stack0xffffffffffffffb4,uVar13);
        do {
          *pbVar4 = (byte)value & 1 | 0x30;
          pbVar4 = pbVar4 + -1;
          bVar12 = 1 < (ulong)value;
          value = (ulong)value >> 1;
        } while (bVar12);
        return;
      }
    }
    else {
      if (spec.type_ == 'X') goto LAB_00109d8a;
      if (spec.type_ == 'b') goto LAB_00109d15;
    }
code_r0x00109f8f:
    internal::report_unknown_type
              (in_stack_ffffffffffffffaf,(char *)CONCAT44(uVar13,in_stack_ffffffffffffffb0));
  }
  if (0x6e < (byte)spec.type_) {
    if (spec.type_ == 'o') {
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        uVar6 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
        (&stack0xffffffffffffffb4)[uVar6] = 0x30;
      }
      uVar13 = 0;
      uVar6 = value;
      do {
        uVar13 = uVar13 + 1;
        bVar12 = 7 < uVar6;
        uVar6 = uVar6 >> 3;
      } while (bVar12);
      pbVar4 = (byte *)prepare_int_buffer<fmt::FormatSpec>
                                 (this,uVar13,&spec,&stack0xffffffffffffffb4,uVar10);
      do {
        *pbVar4 = (byte)value & 7 | 0x30;
        pbVar4 = pbVar4 + -1;
        bVar12 = 7 < (ulong)value;
        value = (ulong)value >> 3;
      } while (bVar12);
      return;
    }
    if (spec.type_ == 'x') {
LAB_00109d8a:
      uVar13 = uVar10;
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        (&stack0xffffffffffffffb4)[uVar10] = 0x30;
        uVar13 = uVar10 | 2;
        (&stack0xffffffffffffffb5)[uVar10] = spec.type_;
      }
      uVar10 = 0;
      uVar6 = value;
      do {
        uVar10 = uVar10 + 1;
        bVar12 = 0xf < uVar6;
        uVar6 = uVar6 >> 4;
      } while (bVar12);
      pcVar5 = prepare_int_buffer<fmt::FormatSpec>
                         (this,uVar10,&spec,&stack0xffffffffffffffb4,uVar13);
      pcVar8 = "0123456789ABCDEF";
      if (spec.type_ == 'x') {
        pcVar8 = "0123456789abcdef";
      }
      do {
        *pcVar5 = pcVar8[(uint)value & 0xf];
        pcVar5 = pcVar5 + -1;
        bVar12 = 0xf < (ulong)value;
        value = (ulong)value >> 4;
      } while (bVar12);
      return;
    }
    goto code_r0x00109f8f;
  }
  if (spec.type_ == 'd') {
LAB_00109e08:
    lVar7 = 0x3f;
    if ((value | 1U) != 0) {
      for (; (value | 1U) >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    uVar13 = ((uint)lVar7 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
    pcVar5 = prepare_int_buffer<fmt::FormatSpec>
                       (this,(uVar13 - ((ulong)value <
                                       internal::BasicData<void>::POWERS_OF_10_64[uVar13])) + 1,
                        &spec,&stack0xffffffffffffffb4,uVar10);
    pcVar5 = pcVar5 + 1;
    uVar6 = value;
    if (99 < (ulong)value) {
      do {
        value = uVar6 / 100;
        *(undefined2 *)(pcVar5 + -2) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (ulong)(uint)((int)uVar6 + (int)value * -100) * 2);
        pcVar5 = pcVar5 + -2;
        bVar12 = 9999 < uVar6;
        uVar6 = value;
      } while (bVar12);
    }
    if ((ulong)value < 10) {
      bVar9 = (byte)value | 0x30;
      lVar7 = -1;
    }
    else {
      pcVar5[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [(value * 2 & 0xffffffffU) + 1];
      bVar9 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              [value * 2 & 0x1fffffffe];
      lVar7 = -2;
    }
    pcVar5[lVar7] = bVar9;
    return;
  }
  if (spec.type_ != 'n') goto code_r0x00109f8f;
  lVar7 = 0x3f;
  if ((value | 1U) != 0) {
    for (; (value | 1U) >> lVar7 == 0; lVar7 = lVar7 + -1) {
    }
  }
  uVar13 = ((uint)lVar7 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  plVar2 = localeconv();
  pcVar8 = plVar2->thousands_sep;
  __n = strlen(pcVar8);
  uVar13 = uVar13 - ((ulong)value < internal::BasicData<void>::POWERS_OF_10_64[uVar13]);
  __dest = prepare_int_buffer<fmt::FormatSpec>
                     (this,uVar13 + (int)__n * (uVar13 / 3) + 1,&spec,&stack0xffffffffffffffb4,
                      uVar10);
  pcVar5 = __dest + 1;
  if ((ulong)value < 100) {
    if (9 < (ulong)value) {
      uVar6 = (ulong)(uint)((int)value * 2);
      *__dest = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                [uVar6 + 1];
      goto LAB_00109f59;
    }
  }
  else {
    lVar7 = -__n;
    uVar13 = 0;
    do {
      uVar10 = uVar13;
      uVar6 = value;
      value = uVar6 / 100;
      uVar11 = (ulong)(uint)(((int)uVar6 + (int)value * -100) * 2);
      pcVar5[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [uVar11 + 1];
      if ((uVar10 | 1) * -0x55555555 < 0x55555556) {
        pcVar5 = pcVar5 + lVar7 + -1;
        if (__n == 0) {
          pcVar5[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                       [uVar11];
          lVar3 = 0;
          if ((uVar10 + 2) * -0x55555555 < 0x55555556) {
            lVar3 = lVar7;
          }
          pcVar5 = pcVar5 + lVar3 + -1;
        }
        else {
          memmove(pcVar5,pcVar8,__n);
          pcVar5[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                       [uVar11];
          pcVar5 = pcVar5 + -1;
          if ((uVar10 + 2) * -0x55555555 < 0x55555556) {
            pcVar5 = pcVar5 + lVar7;
            goto LAB_00109c86;
          }
        }
      }
      else {
        pcVar5[-2] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                     [uVar11];
        pcVar5 = pcVar5 + -2;
        if (((uVar10 + 2) * -0x55555555 < 0x55555556) && (pcVar5 = pcVar5 + lVar7, __n != 0)) {
LAB_00109c86:
          memmove(pcVar5,pcVar8,__n);
        }
      }
      uVar13 = uVar10 + 2;
    } while (9999 < uVar6);
    if (999 < uVar6) {
      uVar6 = (ulong)(uint)((int)value * 2);
      __dest = pcVar5 + -1;
      pcVar5[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [uVar6 + 1];
      if ((uVar10 * -0x55555555 + 1 < 0x55555556) && (__dest = __dest + -__n, __n != 0)) {
        memmove(__dest,pcVar8,__n);
      }
LAB_00109f59:
      bVar9 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              [uVar6];
      pcVar5 = __dest;
      goto LAB_00109f65;
    }
  }
  bVar9 = (byte)value | 0x30;
LAB_00109f65:
  pcVar5[-1] = bVar9;
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#ifndef ANDROID
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}